

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O0

void __thiscall QGraphicsView::QGraphicsView(QGraphicsView *this,QWidget *parent)

{
  QGraphicsViewPrivate *this_00;
  QWidget *in_RSI;
  QAbstractScrollAreaPrivate *in_RDI;
  QAbstractScrollArea *unaff_retaddr;
  QWidget *in_stack_00000008;
  QAbstractScrollArea *in_stack_00000010;
  bool in_stack_00000043;
  WidgetAttribute in_stack_00000044;
  QWidget *in_stack_00000048;
  ColorRole in_stack_ffffffffffffffdc;
  QAbstractScrollAreaPrivate *dd;
  
  dd = in_RDI;
  this_00 = (QGraphicsViewPrivate *)operator_new(0x550);
  QGraphicsViewPrivate::QGraphicsViewPrivate(this_00);
  QAbstractScrollArea::QAbstractScrollArea(unaff_retaddr,dd,in_RSI);
  *(undefined ***)&(in_RDI->super_QFramePrivate).super_QWidgetPrivate = &PTR_metaObject_00d356c0;
  *(undefined ***)&(in_RDI->super_QFramePrivate).super_QWidgetPrivate.field_0x10 =
       &PTR__QGraphicsView_00d358b0;
  QAbstractScrollArea::setViewport(in_stack_00000010,in_stack_00000008);
  QWidget::setAcceptDrops((QWidget *)this_00,SUB41(in_stack_ffffffffffffffdc >> 0x18,0));
  QWidget::setBackgroundRole((QWidget *)this_00,in_stack_ffffffffffffffdc);
  QWidget::setAttribute(in_stack_00000048,in_stack_00000044,in_stack_00000043);
  QAbstractScrollArea::viewport((QAbstractScrollArea *)this_00);
  QWidget::setAttribute(in_stack_00000048,in_stack_00000044,in_stack_00000043);
  return;
}

Assistant:

QGraphicsView::QGraphicsView(QWidget *parent)
    : QAbstractScrollArea(*new QGraphicsViewPrivate, parent)
{
    setViewport(nullptr);
    setAcceptDrops(true);
    setBackgroundRole(QPalette::Base);
    // Investigate leaving these disabled by default.
    setAttribute(Qt::WA_InputMethodEnabled);
    viewport()->setAttribute(Qt::WA_InputMethodEnabled);
}